

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::CreateThreadObject(CPalThread *pThread,CPalThread *pNewThread,HANDLE *phThread)

{
  long *local_70;
  IPalObject *pobjRegisteredThread;
  undefined1 local_60 [4];
  BOOL fThreadDataStoredInObject;
  CObjectAttributes oa;
  CThreadProcessLocalData *pLocalData;
  HANDLE hThread;
  IDataLock *pDataLock;
  IPalObject *pobjThread;
  HANDLE *ppVStack_20;
  PAL_ERROR palError;
  HANDLE *phThread_local;
  CPalThread *pNewThread_local;
  CPalThread *pThread_local;
  
  pobjThread._4_4_ = 0;
  pDataLock = (IDataLock *)0x0;
  pLocalData = (CThreadProcessLocalData *)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  ppVStack_20 = phThread;
  phThread_local = &pNewThread->_vptr_CPalThread;
  pNewThread_local = pThread;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_60);
  pobjRegisteredThread._4_4_ = 0;
  local_70 = (long *)0x0;
  pobjThread._4_4_ =
       (**(code **)*g_pObjectManager)
                 (g_pObjectManager,pNewThread_local,otThread,local_60,&pDataLock);
  if ((pobjThread._4_4_ == 0) &&
     (pobjThread._4_4_ =
           (*pDataLock->_vptr_IDataLock[3])
                     (pDataLock,pNewThread_local,1,&hThread,&oa.pSecurityAttributes),
     pobjThread._4_4_ == 0)) {
    *(HANDLE **)oa.pSecurityAttributes = phThread_local;
    (*(code *)**hThread)(hThread,pNewThread_local,1);
    pobjRegisteredThread._4_4_ = 1;
    pobjThread._4_4_ =
         (**(code **)(*g_pObjectManager + 8))
                   (g_pObjectManager,pNewThread_local,pDataLock,&aotThread,0,&pLocalData,&local_70);
    pDataLock = (IDataLock *)0x0;
    if (pobjThread._4_4_ == 0) {
      phThread_local[0x16] = local_70;
      (**(code **)(*phThread_local[0x16] + 0x38))();
      *ppVStack_20 = pLocalData;
    }
  }
  if (pobjThread._4_4_ != 0) {
    if (pLocalData != (CThreadProcessLocalData *)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pNewThread_local,pLocalData);
    }
    if (phThread_local[0x16] != (HANDLE)0x0) {
      (**(code **)(*phThread_local[0x16] + 0x40))(phThread_local[0x16],pNewThread_local);
    }
    if (pobjRegisteredThread._4_4_ == 0) {
      CPalThread::ReleaseThreadReference((CPalThread *)phThread_local);
    }
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,pNewThread_local);
  }
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x40))(local_70,pNewThread_local);
  }
  return pobjThread._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::CreateThreadObject(
    CPalThread *pThread,
    CPalThread *pNewThread,
    HANDLE *phThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjThread = NULL;
    IDataLock *pDataLock;
    HANDLE hThread = NULL;
    CThreadProcessLocalData *pLocalData = NULL;
    CObjectAttributes oa;
    BOOL fThreadDataStoredInObject = FALSE;
    IPalObject *pobjRegisteredThread = NULL;

    //
    // Create the IPalObject for the thread
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otThread,
        &oa,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto CreateThreadObjectExit;
    }

    //
    // Store the CPalThread inside of the IPalObject
    //

    palError = pobjThread->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto CreateThreadObjectExit;
    }

    pLocalData->pThread = pNewThread;
    pDataLock->ReleaseLock(pThread, TRUE);
    fThreadDataStoredInObject = TRUE;

    //
    // Register the IPalObject (obtaining a handle)
    //

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjThread,
        &aotThread,
        0, //THREAD_ALL_ACCESS,
        &hThread,
        &pobjRegisteredThread
        );

    //
    // pobjThread is invalidated by the call to RegisterObject, so NULL
    // it out here to prevent it from being released
    //

    pobjThread = NULL;

    if (NO_ERROR != palError)
    {
        goto CreateThreadObjectExit;
    }

    //
    // Store the registered object inside of the thread object,
    // adding a reference for the thread itself
    //

    pNewThread->m_pThreadObject = pobjRegisteredThread;
    pNewThread->m_pThreadObject->AddReference();

    *phThread = hThread;

CreateThreadObjectExit:

    if (NO_ERROR != palError)
    {
        if (NULL != hThread)
        {
            g_pObjectManager->RevokeHandle(pThread, hThread);
        }

        if (NULL != pNewThread->m_pThreadObject)
        {
            //
            // Release the new thread's reference on the underlying thread
            // object
            //

            pNewThread->m_pThreadObject->ReleaseReference(pThread);
        }

        if (!fThreadDataStoredInObject)
        {
            //
            // The CPalThread for the new thread was never stored in
            // an IPalObject instance, so we need to release the initial
            // reference here. (If it has been stored it will get freed in
            // the owning object's cleanup routine)
            //

            pNewThread->ReleaseThreadReference();
        }
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    if (NULL != pobjRegisteredThread)
    {
        pobjRegisteredThread->ReleaseReference(pThread);
    }

    return palError;
}